

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int isolat1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  undefined4 in_R8D;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  
  iVar6 = (int)out;
  iVar4 = (int)in;
  auVar12._0_4_ = -(uint)(out == (uchar *)0x0);
  auVar12._4_4_ = -(uint)(in == (uchar *)0x0);
  auVar12._8_4_ = -(uint)(outlen == (int *)0x0);
  auVar12._12_4_ = -(uint)(inlen == (int *)0x0);
  iVar7 = movmskps(in_R8D,auVar12);
  if (iVar7 != 0) {
    return -1;
  }
  pbVar1 = out + *outlen;
  bVar11 = 0 < (long)*inlen;
  pbVar9 = out + (long)*outlen + -1;
  if (out < pbVar9 && bVar11) {
    pbVar8 = in + *inlen;
    pbVar5 = pbVar8;
    do {
      pbVar3 = in;
      if ((char)*in < '\0') {
        *out = *in >> 6 | 0xc0;
        out[1] = *in & 0x3f | 0x80;
        out = out + 2;
        pbVar3 = in + 1;
      }
      lVar10 = (long)pbVar1 - (long)out;
      if (lVar10 < (long)pbVar5 - (long)pbVar3) {
        pbVar5 = pbVar3 + lVar10;
      }
      in = pbVar3;
      if (pbVar3 < pbVar5) {
        lVar10 = (long)pbVar5 - (long)pbVar3;
        do {
          bVar2 = *pbVar3;
          in = pbVar3;
          if ((char)bVar2 < '\0') break;
          pbVar3 = pbVar3 + 1;
          *out = bVar2;
          out = out + 1;
          lVar10 = lVar10 + -1;
          in = pbVar5;
        } while (lVar10 != 0);
      }
      bVar11 = in < pbVar8;
    } while ((bVar11) && (out < pbVar9));
  }
  if ((bVar11) && ((out < pbVar1 && (bVar2 = *in, -1 < (char)bVar2)))) {
    in = in + 1;
    *out = bVar2;
    out = out + 1;
  }
  *outlen = (int)out - iVar6;
  *inlen = (int)in - iVar4;
  return *outlen;
}

Assistant:

int
isolat1ToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend;
    const unsigned char* inend;
    const unsigned char* instop;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(-1);

    outend = out + *outlen;
    inend = in + (*inlen);
    instop = inend;

    while ((in < inend) && (out < outend - 1)) {
	if (*in >= 0x80) {
	    *out++ = (((*in) >>  6) & 0x1F) | 0xC0;
            *out++ = ((*in) & 0x3F) | 0x80;
	    ++in;
	}
	if ((instop - in) > (outend - out)) instop = in + (outend - out);
	while ((in < instop) && (*in < 0x80)) {
	    *out++ = *in++;
	}
    }
    if ((in < inend) && (out < outend) && (*in < 0x80)) {
        *out++ = *in++;
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(*outlen);
}